

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *pPVar2;
  int iVar3;
  FieldDescriptor *descriptor;
  FieldGeneratorBase *__p;
  pointer pFVar4;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  string_view local_108 [2];
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  local_e8;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator;
  undefined1 auStack_d8 [4];
  int i;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"public void WriteTo(pb::CodedOutputStream output) {\n");
  io::Printer::Print<>(pPVar2,local_28);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  io::Printer::Print<>(pPVar2,local_38);
  io::Printer::Indent(local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"output.WriteRawMessage(this);\n");
  io::Printer::Print<>(pPVar2,local_48);
  google::protobuf::io::Printer::Outdent();
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"#else\n");
  io::Printer::Print<>(pPVar2,local_58);
  io::Printer::Indent(local_18);
  GenerateWriteToBody(this,local_18,false);
  google::protobuf::io::Printer::Outdent();
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"#endif\n");
  io::Printer::Print<>(pPVar2,local_68);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"}\n\n");
  io::Printer::Print<>(pPVar2,local_78);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  io::Printer::Print<>(pPVar2,local_88);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_98,"void pb::IBufferMessage.InternalWriteTo(ref pb::WriteContext output) {\n");
  io::Printer::Print<>(pPVar2,local_98);
  io::Printer::Indent(local_18);
  GenerateWriteToBody(this,local_18,true);
  google::protobuf::io::Printer::Outdent();
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}\n");
  io::Printer::Print<>(pPVar2,local_a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"#endif\n\n");
  io::Printer::Print<>(pPVar2,local_b8);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,"public int CalculateSize() {\n");
  io::Printer::Print<>(pPVar2,local_c8);
  io::Printer::Indent(local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d8,"int size = 0;\n");
  io::Printer::Print<>(pPVar2,_auStack_d8);
  generator._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
  _M_head_impl._4_4_ = 0;
  while( true ) {
    iVar1 = generator._M_t.
            super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
            .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
            _M_head_impl._4_4_;
    iVar3 = Descriptor::field_count(this->descriptor_);
    pPVar2 = local_18;
    if (iVar3 <= iVar1) break;
    descriptor = Descriptor::field(this->descriptor_,
                                   generator._M_t.
                                   super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                                   .
                                   super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                                   ._M_head_impl._4_4_);
    __p = CreateFieldGeneratorInternal(this,descriptor);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&local_e8,__p);
    pFVar4 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->(&local_e8);
    (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xc])(pFVar4,local_18);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr(&local_e8);
    generator._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
    _M_head_impl._4_4_ =
         generator._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
         .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
         _M_head_impl._4_4_ + 1;
  }
  if ((this->has_extension_ranges_ & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_108,"if (_extensions != null) {\n  size += _extensions.CalculateSize();\n}\n");
    io::Printer::Print<>(pPVar2,local_108[0]);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,
             "if (_unknownFields != null) {\n  size += _unknownFields.CalculateSize();\n}\n");
  io::Printer::Print<>(pPVar2,local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,"return size;\n");
  io::Printer::Print<>(pPVar2,local_128);
  google::protobuf::io::Printer::Outdent();
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}\n\n");
  io::Printer::Print<>(pPVar2,local_138);
  return;
}

Assistant:

void MessageGenerator::GenerateMessageSerializationMethods(
    io::Printer* printer) {
  WriteGeneratedCodeAttributes(printer);
  printer->Print("public void WriteTo(pb::CodedOutputStream output) {\n");
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Indent();
  printer->Print("output.WriteRawMessage(this);\n");
  printer->Outdent();
  printer->Print("#else\n");
  printer->Indent();
  GenerateWriteToBody(printer, false);
  printer->Outdent();
  printer->Print("#endif\n");
  printer->Print("}\n\n");

  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "void pb::IBufferMessage.InternalWriteTo(ref pb::WriteContext output) "
      "{\n");
  printer->Indent();
  GenerateWriteToBody(printer, true);
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endif\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print("public int CalculateSize() {\n");
  printer->Indent();
  printer->Print("int size = 0;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->GenerateSerializedSizeCode(printer);
  }

  if (has_extension_ranges_) {
    printer->Print(
        "if (_extensions != null) {\n"
        "  size += _extensions.CalculateSize();\n"
        "}\n");
  }

  printer->Print(
      "if (_unknownFields != null) {\n"
      "  size += _unknownFields.CalculateSize();\n"
      "}\n");

  printer->Print("return size;\n");
  printer->Outdent();
  printer->Print("}\n\n");
}